

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformInfiniteLight *p,Transform *args,
          DenselySampledSpectrum **args_1,float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  undefined8 in_RCX;
  Float scale;
  SpectrumHandle *in_RDX;
  Transform *in_RSI;
  UniformInfiniteLight *in_RDI;
  Allocator unaff_retaddr;
  DenselySampledSpectrum *in_stack_ffffffffffffffa8;
  
  scale = (Float)((ulong)in_RCX >> 0x20);
  pbrt::SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((SpectrumHandle *)in_RSI,in_stack_ffffffffffffffa8);
  pbrt::UniformInfiniteLight::UniformInfiniteLight(in_RDI,in_RSI,in_RDX,scale,unaff_retaddr);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }